

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::remove_unused_vars(Generator *top)

{
  undefined1 local_80 [8];
  VarUnusedVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_80 = (undefined1  [8])&PTR_visit_root_002ab328;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.error_mutex_.super___mutex_base._M_mutex.__align = 0;
  visitor.error_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  visitor.error_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  visitor.error_mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_80,top);
  IRVisitor::~IRVisitor((IRVisitor *)local_80);
  return;
}

Assistant:

void remove_unused_vars(Generator* top) {
    VarUnusedVisitor visitor;
    visitor.visit_generator_root_p(top);
}